

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O2

void joypad_delete(JoypadBuffer *buffer)

{
  JoypadBuffer *pJVar1;
  JoypadBuffer *__ptr;
  
  if (buffer != (JoypadBuffer *)0x0) {
    __ptr = (JoypadBuffer *)(buffer->sentinel).next;
    while (__ptr != buffer) {
      pJVar1 = (JoypadBuffer *)(__ptr->sentinel).next;
      free((__ptr->sentinel).data);
      free(__ptr);
      __ptr = pJVar1;
    }
    free(buffer);
    return;
  }
  return;
}

Assistant:

void joypad_delete(JoypadBuffer* buffer) {
  if (!buffer) {
    return;
  }
  JoypadChunk* current = buffer->sentinel.next;
  while (current != &buffer->sentinel) {
    JoypadChunk* next = current->next;
    xfree(current->data);
    xfree(current);
    current = next;
  }
  xfree(buffer);
}